

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

void xmlSchemaFreeParserCtxt(xmlSchemaParserCtxtPtr ctxt)

{
  if (ctxt != (xmlSchemaParserCtxtPtr)0x0) {
    if ((ctxt->doc != (xmlDocPtr)0x0) && (ctxt->preserve == 0)) {
      xmlFreeDoc(ctxt->doc);
    }
    if (ctxt->vctxt != (xmlSchemaValidCtxtPtr)0x0) {
      xmlSchemaFreeValidCtxt(ctxt->vctxt);
    }
    if ((ctxt->ownsConstructor != 0) && (ctxt->constructor != (xmlSchemaConstructionCtxtPtr)0x0)) {
      xmlSchemaConstructionCtxtFree(ctxt->constructor);
      ctxt->constructor = (xmlSchemaConstructionCtxtPtr)0x0;
      ctxt->ownsConstructor = 0;
    }
    if (ctxt->attrProhibs != (xmlSchemaItemListPtr)0x0) {
      xmlSchemaItemListFree(ctxt->attrProhibs);
    }
    xmlDictFree(ctxt->dict);
    (*xmlFree)(ctxt);
    return;
  }
  return;
}

Assistant:

void
xmlSchemaFreeParserCtxt(xmlSchemaParserCtxtPtr ctxt)
{
    if (ctxt == NULL)
        return;
    if (ctxt->doc != NULL && !ctxt->preserve)
        xmlFreeDoc(ctxt->doc);
    if (ctxt->vctxt != NULL) {
	xmlSchemaFreeValidCtxt(ctxt->vctxt);
    }
    if (ctxt->ownsConstructor && (ctxt->constructor != NULL)) {
	xmlSchemaConstructionCtxtFree(ctxt->constructor);
	ctxt->constructor = NULL;
	ctxt->ownsConstructor = 0;
    }
    if (ctxt->attrProhibs != NULL)
	xmlSchemaItemListFree(ctxt->attrProhibs);
    xmlDictFree(ctxt->dict);
    xmlFree(ctxt);
}